

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O0

string * __thiscall
pfederc::UnOpExpr::toString_abi_cxx11_(string *__return_storage_ptr__,UnOpExpr *this)

{
  TokenType TVar1;
  Expr *pEVar2;
  Token *pTVar3;
  Lexer *pLVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  UnOpExpr *local_18;
  UnOpExpr *this_local;
  
  local_18 = this;
  this_local = (UnOpExpr *)__return_storage_ptr__;
  TVar1 = getOperatorType(this);
  if (TVar1 == TOK_OP_BRACKET_OPEN) {
    pEVar2 = getExpression(this);
    (*pEVar2->_vptr_Expr[2])();
    std::operator+(&local_38,'(',&local_58);
    std::operator+(__return_storage_ptr__,&local_38,')');
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
  }
  else {
    pTVar3 = getOperatorToken(this);
    pLVar4 = Expr::getLexer(&this->super_Expr);
    (*pTVar3->_vptr_Token[2])(&local_d8,pTVar3,pLVar4);
    std::operator+(&local_b8,'(',&local_d8);
    std::operator+(&local_98,&local_b8,' ');
    pEVar2 = getExpression(this);
    (*pEVar2->_vptr_Expr[2])();
    std::operator+(&local_78,&local_98,&local_f8);
    std::operator+(__return_storage_ptr__,&local_78,')');
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string UnOpExpr::toString() const noexcept {
  if (getOperatorType() == TokenType::TOK_OP_BRACKET_OPEN) {
    return '(' + getExpression().toString() + ')';
  }

  return '(' + getOperatorToken().toString(getLexer()) +
    ' ' + getExpression().toString() + ')';
}